

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_column.h
# Opt level: O0

Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
::operator*=(Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
             *this,uint v)

{
  Matrix_entry *entry_00;
  Zp_field_operators<unsigned_int,_void> *this_00;
  bool bVar1;
  Element e2;
  Element EVar2;
  invalid_argument *this_01;
  reference ppEVar3;
  uint *e1;
  Entry *entry;
  iterator __end0;
  iterator __begin0;
  Column_support *__range3;
  Field_element val;
  uint v_local;
  Vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *this_local;
  
  e2 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_value(this->operators_,v);
  EVar2 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_additive_identity();
  if (e2 != EVar2) {
    EVar2 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_multiplicative_identity
                      ();
    if (e2 != EVar2) {
      __end0 = std::
               vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ::begin(&this->column_);
      entry = (Entry *)std::
                       vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ::end(&this->column_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0,(__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>_>
                                         *)&entry), bVar1) {
        ppEVar3 = __gnu_cxx::
                  __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>_>
                  ::operator*(&__end0);
        entry_00 = *ppEVar3;
        this_00 = this->operators_;
        e1 = Entry_field_element<unsigned_int>::get_element
                       (&entry_00->super_Entry_field_element_option);
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace(this_00,e1,e2);
        Row_access<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
        ::update_entry(&this->super_Row_access_option,entry_00);
        __gnu_cxx::
        __normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_**,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>_>
        ::operator++(&__end0);
      }
    }
    return this;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"A chain column should not be multiplied by 0.");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline Vector_column<Master_matrix>& Vector_column<Master_matrix>::operator*=(unsigned int v)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    if (v % 2 == 0) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
    }
  } else {
    Field_element val = operators_->get_value(v);

    if (val == Field_operators::get_additive_identity()) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
      return *this;
    }

    if (val == Field_operators::get_multiplicative_identity()) return *this;

    for (Entry* entry : column_) {
      operators_->multiply_inplace(entry->get_element(), val);
      if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*entry);
    }
  }

  return *this;
}